

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

char * modTimeToStr(PHYSFS_sint64 modtime,char *modstr,size_t strsize)

{
  char *__src;
  time_t t;
  PHYSFS_sint64 local_10;
  
  if (modtime < 0) {
    modstr[0x2f] = '\0';
    modstr[0x30] = '\0';
    modstr[0x31] = '\0';
    modstr[0x32] = '\0';
    modstr[0x33] = '\0';
    modstr[0x34] = '\0';
    modstr[0x35] = '\0';
    modstr[0x36] = '\0';
    modstr[0x37] = '\0';
    modstr[0x38] = '\0';
    modstr[0x39] = '\0';
    modstr[0x3a] = '\0';
    modstr[0x3b] = '\0';
    modstr[0x3c] = '\0';
    modstr[0x3d] = '\0';
    modstr[0x3e] = '\0';
    modstr[0x20] = '\0';
    modstr[0x21] = '\0';
    modstr[0x22] = '\0';
    modstr[0x23] = '\0';
    modstr[0x24] = '\0';
    modstr[0x25] = '\0';
    modstr[0x26] = '\0';
    modstr[0x27] = '\0';
    modstr[0x28] = '\0';
    modstr[0x29] = '\0';
    modstr[0x2a] = '\0';
    modstr[0x2b] = '\0';
    modstr[0x2c] = '\0';
    modstr[0x2d] = '\0';
    modstr[0x2e] = '\0';
    modstr[0x2f] = '\0';
    modstr[0x10] = '\0';
    modstr[0x11] = '\0';
    modstr[0x12] = '\0';
    modstr[0x13] = '\0';
    modstr[0x14] = '\0';
    modstr[0x15] = '\0';
    modstr[0x16] = '\0';
    modstr[0x17] = '\0';
    modstr[0x18] = '\0';
    modstr[0x19] = '\0';
    modstr[0x1a] = '\0';
    modstr[0x1b] = '\0';
    modstr[0x1c] = '\0';
    modstr[0x1d] = '\0';
    modstr[0x1e] = '\0';
    modstr[0x1f] = '\0';
    builtin_strncpy(modstr,"Unknown\n",9);
    modstr[9] = '\0';
    modstr[10] = '\0';
    modstr[0xb] = '\0';
    modstr[0xc] = '\0';
    modstr[0xd] = '\0';
    modstr[0xe] = '\0';
    modstr[0xf] = '\0';
  }
  else {
    local_10 = modtime;
    __src = ctime(&local_10);
    strncpy(modstr,__src,0x40);
  }
  modstr[0x3f] = '\0';
  return modstr;
}

Assistant:

static char* modTimeToStr(PHYSFS_sint64 modtime, char *modstr, size_t strsize)
{
    if (modtime < 0)
        strncpy(modstr, "Unknown\n", strsize);
    else
    {
        time_t t = (time_t) modtime;
        char *str = ctime(&t);
        strncpy(modstr, str, strsize);
    } /* else */

    modstr[strsize-1] = '\0';
    return modstr;
}